

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPropertyDefinition.cxx
# Opt level: O1

void __thiscall
cmPropertyDefinitionMap::DefineProperty
          (cmPropertyDefinitionMap *this,string *name,ScopeType scope,string *ShortDescription,
          string *FullDescription,bool chain,string *initializeFromVariable)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  iterator iVar3;
  bool local_6d;
  ScopeType local_6c;
  key_type local_68;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmProperty::ScopeType_&>
  local_40;
  
  paVar1 = &local_68.first.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_6d = chain;
  local_6c = scope;
  local_68.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + name->_M_string_length);
  local_68.second = local_6c;
  iVar3 = std::
          _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
          ::find((_Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
                  *)this,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((_Rb_tree_header *)iVar3._M_node == &(this->Map_)._M_t._M_impl.super__Rb_tree_header) {
    local_40.
    super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmProperty::ScopeType_&>
    .super__Tuple_impl<1UL,_cmProperty::ScopeType_&>.
    super__Head_base<1UL,_cmProperty::ScopeType_&,_false>._M_head_impl =
         (_Head_base<1UL,_cmProperty::ScopeType_&,_false>)&local_6c;
    local_68.first._M_dataplus._M_p = (pointer)initializeFromVariable;
    local_68.first._M_string_length = (size_type)&local_6d;
    local_68.first.field_2._M_allocated_capacity = (size_type)FullDescription;
    local_68.first.field_2._8_8_ = ShortDescription;
    local_40.
    super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmProperty::ScopeType_&>
    .
    super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
    ._M_head_impl = name;
    std::
    _Rb_tree<std::pair<std::__cxx11::string,cmProperty::ScopeType>,std::pair<std::pair<std::__cxx11::string,cmProperty::ScopeType>const,cmPropertyDefinition>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,cmProperty::ScopeType>const,cmPropertyDefinition>>,std::less<std::pair<std::__cxx11::string,cmProperty::ScopeType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmProperty::ScopeType>const,cmPropertyDefinition>>>
    ::
    _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&,cmProperty::ScopeType&>,std::tuple<std::__cxx11::string_const&,std::__cxx11::string_const&,bool&,std::__cxx11::string_const&>>
              ((_Rb_tree<std::pair<std::__cxx11::string,cmProperty::ScopeType>,std::pair<std::pair<std::__cxx11::string,cmProperty::ScopeType>const,cmPropertyDefinition>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,cmProperty::ScopeType>const,cmPropertyDefinition>>,std::less<std::pair<std::__cxx11::string,cmProperty::ScopeType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmProperty::ScopeType>const,cmPropertyDefinition>>>
                *)this,(piecewise_construct_t *)&std::piecewise_construct,&local_40,
               (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_68);
  }
  return;
}

Assistant:

void cmPropertyDefinitionMap::DefineProperty(
  const std::string& name, cmProperty::ScopeType scope,
  const std::string& ShortDescription, const std::string& FullDescription,
  bool chain, const std::string& initializeFromVariable)
{
  auto it = this->Map_.find(KeyType(name, scope));
  if (it == this->Map_.end()) {
    // try_emplace() since C++17
    this->Map_.emplace(std::piecewise_construct,
                       std::forward_as_tuple(name, scope),
                       std::forward_as_tuple(ShortDescription, FullDescription,
                                             chain, initializeFromVariable));
  }
}